

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void pack_cell(int i,int j,int k,vector<int,_std::allocator<int>_> *particle_numbers,
              size_t *pn_index,vector<particle,_std::allocator<particle>_> *particles,
              size_t *p_index)

{
  int *piVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  particle *ppVar16;
  particle *ppVar17;
  size_t sVar18;
  ulong uVar19;
  pointer ppVar20;
  ulong uVar21;
  double *pdVar22;
  
  pdVar22 = *(double **)
             (*(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                  .super__Head_base<0UL,_spatial_region_*,_false>.
                                                  _M_head_impl + 0x218) + (long)i * 8) + (long)j * 8
                       ) + (long)k * 0x10);
  sVar18 = *pn_index;
  (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_start[sVar18] = 0;
  while (pdVar22 != (double *)0x0) {
    ppVar20 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppVar20) / 0x68;
    uVar21 = *p_index;
    if (uVar19 <= uVar21) {
      std::vector<particle,_std::allocator<particle>_>::resize(particles,uVar19 + 1 + (uVar19 >> 1))
      ;
      uVar21 = *p_index;
      ppVar20 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    *p_index = uVar21 + 1;
    dVar3 = *pdVar22;
    dVar4 = pdVar22[1];
    dVar5 = pdVar22[2];
    dVar6 = pdVar22[3];
    dVar7 = pdVar22[4];
    dVar8 = pdVar22[5];
    dVar9 = pdVar22[6];
    dVar10 = pdVar22[7];
    dVar11 = pdVar22[6];
    dVar12 = pdVar22[7];
    dVar13 = pdVar22[8];
    dVar14 = pdVar22[9];
    dVar15 = pdVar22[10];
    ppVar16 = (particle *)pdVar22[0xb];
    ppVar17 = (particle *)pdVar22[0xc];
    pdVar2 = &ppVar20[uVar21].uz;
    *pdVar2 = pdVar22[5];
    pdVar2[1] = dVar11;
    pdVar2[2] = dVar12;
    pdVar2[3] = dVar13;
    pdVar2[4] = dVar14;
    pdVar2[5] = dVar15;
    pdVar2[6] = (double)ppVar16;
    pdVar2[7] = (double)ppVar17;
    ppVar20 = ppVar20 + uVar21;
    ppVar20->x = dVar3;
    ppVar20->y = dVar4;
    ppVar20->z = dVar5;
    ppVar20->ux = dVar6;
    ppVar20->uy = dVar7;
    ppVar20->uz = dVar8;
    ppVar20->g = dVar9;
    ppVar20->q = dVar10;
    sVar18 = *pn_index;
    pdVar22 = (double *)pdVar22[0xb];
    piVar1 = (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start + sVar18;
    *piVar1 = *piVar1 + 1;
  }
  *pn_index = sVar18 + 1;
  return;
}

Assistant:

void pack_cell(int i, int j, int k, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    particle* current = psr->cp[i][j][k].pl.head;
    particle_numbers[pn_index] = 0;
    while (current != 0) {
        if (particles.size() <= p_index) {
            particles.resize(3 * particles.size() / 2 + 1);
        }
        particles[p_index++] = *current;

        current = current->next;
        particle_numbers[pn_index]++;
    }
    pn_index++;
}